

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueSVMUnmap(cl_command_queue command_queue,void *svm_ptr,
                        cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  CLIntercept *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  cl_icd_dispatch *pcVar4;
  SConfig *pSVar5;
  CObjectTracker *pCVar6;
  cl_event *in_RCX;
  cl_uint in_EDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  cl_event *in_R8;
  CLIntercept *in_stack_000000c8;
  time_point toolEnd_1;
  time_point toolStart_1;
  cl_int e;
  time_point toolEnd;
  time_point toolStart;
  time_point cpuEnd;
  time_point cpuStart;
  bool isLocalEvent;
  cl_event local_event;
  time_point queuedTime;
  string eventWaitListString;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLIntercept *pIntercept;
  char *in_stack_fffffffffffffb38;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  _cl_event *in_stack_fffffffffffffb50;
  allocator *paVar8;
  CObjectTracker *in_stack_fffffffffffffb58;
  CLIntercept *in_stack_fffffffffffffb60;
  CLIntercept *in_stack_fffffffffffffb68;
  CLIntercept *in_stack_fffffffffffffb70;
  SConfig *in_stack_fffffffffffffb98;
  CLIntercept *in_stack_fffffffffffffba0;
  CLIntercept *in_stack_fffffffffffffba8;
  cl_event p_Var9;
  cl_event *in_stack_fffffffffffffbb0;
  cl_event *in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  cl_uint numEvents;
  char *in_stack_fffffffffffffbc8;
  CLIntercept *in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  undefined1 includeId;
  SConfig *in_stack_fffffffffffffbe0;
  SConfig *in_stack_fffffffffffffbe8;
  CLIntercept *in_stack_fffffffffffffbf0;
  time_point in_stack_fffffffffffffbf8;
  time_point in_stack_fffffffffffffc00;
  time_point in_stack_fffffffffffffc08;
  time_point in_stack_fffffffffffffc10;
  SConfig *in_stack_fffffffffffffc40;
  cl_icd_dispatch *in_stack_fffffffffffffc48;
  CLIntercept *in_stack_fffffffffffffc50;
  cl_command_queue p_Var10;
  undefined6 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  allocator *in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  time_point in_stack_fffffffffffffc80;
  bool local_372;
  SConfig *in_stack_fffffffffffffc90;
  cl_int in_stack_fffffffffffffd54;
  char *in_stack_fffffffffffffd58;
  cl_int errorCode;
  CLIntercept *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  CLIntercept *in_stack_fffffffffffffd70;
  allocator local_259;
  string local_258 [32];
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  allocator local_201;
  string local_200 [16];
  string local_1c8 [32];
  undefined8 local_1a8;
  cl_int local_19c;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  size_t *local_178;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  undefined8 local_120;
  byte local_113;
  byte local_112;
  allocator local_111;
  string local_110 [32];
  undefined8 local_f0;
  size_t *local_e8;
  allocator local_d9;
  size_t *in_stack_ffffffffffffff28;
  cl_uint in_stack_ffffffffffffff34;
  cl_kernel in_stack_ffffffffffffff38;
  uint64_t in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  CLIntercept *in_stack_ffffffffffffff50;
  undefined8 local_a8;
  size_t *in_stack_ffffffffffffff60;
  cl_command_queue in_stack_ffffffffffffff68;
  cl_event local_88;
  undefined8 local_80;
  string local_68 [32];
  cl_command_queue local_48;
  cl_int local_3c;
  CLIntercept *local_38;
  cl_event *local_30;
  cl_event *local_28;
  cl_uint local_1c;
  char *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  cl_int local_4;
  
  includeId = (undefined1)((ulong)in_stack_fffffffffffffbd8 >> 0x38);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38 = GetIntercept();
  if ((local_38 == (CLIntercept *)0x0) ||
     (pcVar4 = CLIntercept::dispatch(local_38),
     pcVar4->clEnqueueSVMUnmap == (cl_api_clEnqueueSVMUnmap)0x0)) {
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,(int *)&stack0xfffffffffffffd54)
    ;
    local_4 = -0x24;
  }
  else {
    local_3c = 0;
    local_48 = (cl_command_queue)CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffba8);
    pSVar5 = CLIntercept::config(local_38);
    if ((((pSVar5->AubCapture & 1U) != 0) &&
        (bVar2 = CLIntercept::checkAubCaptureEnqueueLimits(local_38,(uint64_t)local_48), bVar2)) &&
       (pSVar5 = CLIntercept::config(local_38), (pSVar5->AubCaptureIndividualEnqueues & 1U) == 0)) {
      in_stack_fffffffffffffb38 = (char *)0x0;
      in_stack_fffffffffffffb40 = local_10;
      CLIntercept::startAubCapture
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
    }
    pSVar5 = CLIntercept::config(local_38);
    if ((pSVar5->NullEnqueue & 1U) == 0) {
      getFormattedEventWaitList_abi_cxx11_
                (in_stack_fffffffffffffb68,(cl_uint)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                 (cl_event *)in_stack_fffffffffffffb58);
      pSVar5 = CLIntercept::config(local_38);
      pbVar1 = local_10;
      pcVar7 = local_18;
      this = local_38;
      p_Var10 = local_48;
      if ((pSVar5->CallLogging & 1U) != 0) {
        in_stack_fffffffffffffb40 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::c_str();
        CLIntercept::callLoggingEnter
                  (this,"clEnqueueSVMUnmap",(uint64_t)p_Var10,(cl_kernel)0x0,
                   "queue = %p, svm_ptr = %p%s",pbVar1);
        in_stack_fffffffffffffb38 = pcVar7;
      }
      pSVar5 = CLIntercept::config(local_38);
      if ((pSVar5->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,numEvents,
                   in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb40);
      local_88 = (cl_event)0x0;
      bVar2 = false;
      pSVar5 = CLIntercept::config(local_38);
      if ((((pSVar5->DevicePerformanceTiming & 1U) != 0) ||
          (pSVar5 = CLIntercept::config(local_38), (pSVar5->ITTPerformanceTiming & 1U) != 0)) ||
         ((pSVar5 = CLIntercept::config(local_38), (pSVar5->ChromePerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(local_38),
          (pSVar5->DevicePerfCounterEventBasedSampling & 1U) != 0)))) {
        local_80 = std::chrono::_V2::steady_clock::now();
        bVar2 = local_30 == (cl_event *)0x0;
        if (bVar2) {
          local_30 = &local_88;
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb40);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb40);
      pSVar5 = CLIntercept::config(local_38);
      if (((pSVar5->HostPerformanceTiming & 1U) != 0) ||
         (pSVar5 = CLIntercept::config(local_38), (pSVar5->ChromeCallLogging & 1U) != 0)) {
        in_stack_ffffffffffffff60 = (size_t *)std::chrono::_V2::steady_clock::now();
      }
      pcVar4 = CLIntercept::dispatch(local_38);
      local_3c = (*pcVar4->clEnqueueSVMUnmap)
                           ((cl_command_queue)local_10,local_18,local_1c,local_28,local_30);
      pSVar5 = CLIntercept::config(local_38);
      if (((pSVar5->HostPerformanceTiming & 1U) != 0) ||
         (pSVar5 = CLIntercept::config(local_38), (pSVar5->ChromeCallLogging & 1U) != 0)) {
        local_a8 = std::chrono::_V2::steady_clock::now();
        pSVar5 = CLIntercept::config(local_38);
        if (((pSVar5->HostPerformanceTiming & 1U) != 0) &&
           (bVar3 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_38,(uint64_t)local_48), bVar3)) {
          std::allocator<char>::allocator();
          local_e8 = in_stack_ffffffffffffff60;
          std::__cxx11::string::string((string *)&stack0xffffffffffffff28,"",&local_d9);
          local_f0 = local_a8;
          in_stack_ffffffffffffff60 = local_e8;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffc00.__d.__r,
                     (char *)in_stack_fffffffffffffbf8.__d.__r,(string *)in_stack_fffffffffffffbf0,
                     in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
          std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        }
      }
      pSVar5 = CLIntercept::config(local_38);
      if ((((((pSVar5->DevicePerformanceTiming & 1U) != 0) ||
            (pSVar5 = CLIntercept::config(local_38), (pSVar5->ITTPerformanceTiming & 1U) != 0)) ||
           (pSVar5 = CLIntercept::config(local_38), (pSVar5->ChromePerformanceTiming & 1U) != 0)) ||
          (in_stack_fffffffffffffc90 = CLIntercept::config(local_38),
          (in_stack_fffffffffffffc90->DevicePerfCounterEventBasedSampling & 1U) != 0)) &&
         (local_30 != (cl_event *)0x0)) {
        local_112 = 0;
        local_113 = 0;
        bVar3 = CLIntercept::checkDevicePerformanceTimingEnqueueLimits(local_38,(uint64_t)local_48);
        local_372 = false;
        if (bVar3) {
          in_stack_fffffffffffffc80.__d.__r = (duration)CLIntercept::config(local_38);
          local_372 = true;
          in_stack_fffffffffffffc7f = local_372;
          if ((((SConfig *)in_stack_fffffffffffffc80.__d.__r)->DevicePerformanceTimingSkipUnmap & 1U
              ) != 0) {
            in_stack_fffffffffffffc70 = &local_111;
            std::allocator<char>::allocator();
            local_112 = 1;
            std::__cxx11::string::string(local_110,"clEnqueueSVMUnmap",in_stack_fffffffffffffc70);
            local_113 = 1;
            in_stack_fffffffffffffc6f =
                 std::operator!=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
            in_stack_fffffffffffffc7f = in_stack_fffffffffffffc6f;
            local_372 = (bool)in_stack_fffffffffffffc6f;
          }
        }
        if ((local_113 & 1) != 0) {
          std::__cxx11::string::~string(local_110);
        }
        if ((local_112 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
        }
        if ((local_372 & 1U) != 0) {
          local_120 = local_80;
          paVar8 = &local_141;
          in_stack_fffffffffffffc50 = local_38;
          p_Var10 = local_48;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_140,"",paVar8);
          CLIntercept::addTimingEvent
                    ((CLIntercept *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
                     (char *)in_stack_fffffffffffffc70,
                     CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(local_372,in_stack_fffffffffffffc68)),
                     in_stack_fffffffffffffc80,(string *)paVar8,p_Var10,
                     (cl_event)in_stack_fffffffffffffc90);
          std::__cxx11::string::~string(local_140);
          std::allocator<char>::~allocator((allocator<char> *)&local_141);
        }
        if (bVar2) {
          in_stack_fffffffffffffc48 = CLIntercept::dispatch(local_38);
          (*in_stack_fffffffffffffc48->clReleaseEvent)(*local_30);
          local_30 = (cl_event *)0x0;
        }
      }
      in_stack_fffffffffffffc40 = CLIntercept::config(local_38);
      if (((((in_stack_fffffffffffffc40->ErrorLogging & 1U) != 0) ||
           (pSVar5 = CLIntercept::config(local_38), (pSVar5->ErrorAssert & 1U) != 0)) ||
          (pSVar5 = CLIntercept::config(local_38), (pSVar5->NoErrors & 1U) != 0)) && (local_3c != 0)
         ) {
        pSVar5 = CLIntercept::config(local_38);
        if ((pSVar5->ErrorLogging & 1U) != 0) {
          CLIntercept::logError
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd54);
        }
        pSVar5 = CLIntercept::config(local_38);
        if ((pSVar5->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        pSVar5 = CLIntercept::config(local_38);
        if ((pSVar5->NoErrors & 1U) != 0) {
          local_3c = 0;
        }
      }
      if ((local_18 != (char *)0x0) &&
         (((in_stack_fffffffffffffc10.__d.__r = (duration)CLIntercept::config(local_38),
           (((SConfig *)in_stack_fffffffffffffc10.__d.__r)->ChromeCallLogging & 1U) != 0 ||
           (in_stack_fffffffffffffc08.__d.__r = (duration)CLIntercept::config(local_38),
           (((SConfig *)in_stack_fffffffffffffc08.__d.__r)->HostPerformanceTiming & 1U) != 0)) ||
          ((in_stack_fffffffffffffc00.__d.__r = (duration)CLIntercept::config(local_38),
           ((ulong)(((CLIntercept *)in_stack_fffffffffffffc00.__d.__r)->m_Dispatch).
                   clCreateContextFromType & 0x10000) != 0 ||
           (((in_stack_fffffffffffffbf8.__d.__r = (duration)CLIntercept::config(local_38),
             (((SConfig *)in_stack_fffffffffffffbf8.__d.__r)->ITTPerformanceTiming & 1U) != 0 ||
             (in_stack_fffffffffffffbf0 = (CLIntercept *)CLIntercept::config(local_38),
             ((ulong)(in_stack_fffffffffffffbf0->m_Dispatch).clRetainSampler & 0x1000000000000) != 0
             )) || (in_stack_fffffffffffffbe8 = CLIntercept::config(local_38),
                   (in_stack_fffffffffffffbe8->DevicePerfCounterEventBasedSampling & 1U) != 0)))))))
         ) {
        CLIntercept::removeMapPointer(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      }
      in_stack_fffffffffffffbe0 = CLIntercept::config(local_38);
      if ((in_stack_fffffffffffffbe0->LeakChecking & 1U) != 0) {
        pCVar6 = CLIntercept::objectTracker(local_38);
        includeId = (undefined1)((ulong)pCVar6 >> 0x38);
        if (local_30 == (cl_event *)0x0) {
          in_stack_fffffffffffffbd0 = (CLIntercept *)0x0;
        }
        else {
          in_stack_fffffffffffffbd0 = (CLIntercept *)*local_30;
        }
        CObjectTracker::AddAllocation<_cl_event*>
                  (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      }
      pSVar5 = CLIntercept::config(local_38);
      if ((pSVar5->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffbd0,&pSVar5->SuppressLogging,numEvents,
                   in_stack_fffffffffffffbb8,(cl_sync_point_khr *)in_stack_fffffffffffffbb0);
      }
      pSVar5 = CLIntercept::config(local_38);
      if ((pSVar5->ChromeCallLogging & 1U) != 0) {
        paVar8 = &local_169;
        std::allocator<char>::allocator();
        local_178 = in_stack_ffffffffffffff60;
        std::__cxx11::string::string(local_168,"",paVar8);
        local_180 = local_a8;
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffbf0,&in_stack_fffffffffffffbe8->SuppressLogging,
                   (string *)in_stack_fffffffffffffbe0,(bool)includeId,
                   (uint64_t)in_stack_fffffffffffffbd0,in_stack_fffffffffffffc00,
                   in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(local_168);
        std::allocator<char>::~allocator((allocator<char> *)&local_169);
      }
      if (local_30 == (cl_event *)0x0) {
        p_Var9 = (cl_event)0x0;
      }
      else {
        p_Var9 = *local_30;
      }
      if ((p_Var9 != (cl_event)0x0) &&
         ((in_stack_fffffffffffffba0 = (CLIntercept *)CLIntercept::config(local_38),
          ((in_stack_fffffffffffffba0->m_Mutex).super___mutex_base._M_mutex.__size[0x11] & 1U) != 0
          || (in_stack_fffffffffffffb98 = CLIntercept::config(local_38),
             (in_stack_fffffffffffffb98->ChromePerformanceTiming & 1U) != 0)))) {
        CLIntercept::addEvent
                  (in_stack_fffffffffffffb70,(cl_event)in_stack_fffffffffffffb68,
                   (uint64_t)in_stack_fffffffffffffb60);
      }
      std::__cxx11::string::~string(local_68);
    }
    errorCode = (cl_int)((ulong)in_stack_fffffffffffffd58 >> 0x20);
    pSVar5 = CLIntercept::config(local_38);
    if ((pSVar5->FinishAfterEnqueue & 1U) == 0) {
      pSVar5 = CLIntercept::config(local_38);
      if ((pSVar5->FlushAfterEnqueue & 1U) != 0) {
        pcVar4 = CLIntercept::dispatch(local_38);
        (*pcVar4->clFlush)((cl_command_queue)local_10);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb40);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb40);
      pSVar5 = CLIntercept::config(local_38);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(local_38), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(local_38), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_198 = std::chrono::_V2::steady_clock::now();
        local_188 = local_198;
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                (in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48,
                 &in_stack_fffffffffffffc40->SuppressLogging);
      pcVar4 = CLIntercept::dispatch(local_38);
      local_19c = (*pcVar4->clFinish)((cl_command_queue)local_10);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                 (char *)in_stack_fffffffffffffd60,errorCode);
      pSVar5 = CLIntercept::config(local_38);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(local_38), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(local_38), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_1a8 = std::chrono::_V2::steady_clock::now();
        local_190 = local_1a8;
        pSVar5 = CLIntercept::config(local_38);
        if (((pSVar5->HostPerformanceTiming & 1U) != 0) &&
           (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_38,(uint64_t)local_48), bVar2)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1c8,"",(allocator *)&stack0xfffffffffffffe37);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffc00.__d.__r,
                     (char *)in_stack_fffffffffffffbf8.__d.__r,(string *)in_stack_fffffffffffffbf0,
                     in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          std::__cxx11::string::~string(local_1c8);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
        }
        pSVar5 = CLIntercept::config(local_38);
        if ((pSVar5->ChromeCallLogging & 1U) != 0) {
          paVar8 = &local_201;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_200,"",paVar8);
          local_210 = local_188;
          local_218 = local_190;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffbf0,&in_stack_fffffffffffffbe8->SuppressLogging,
                     (string *)in_stack_fffffffffffffbe0,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffbd0,in_stack_fffffffffffffc00,
                     in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string(local_200);
          std::allocator<char>::~allocator((allocator<char> *)&local_201);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb40);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffb40);
      pSVar5 = CLIntercept::config(local_38);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(local_38), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(local_38), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_230 = std::chrono::_V2::steady_clock::now();
        local_220 = local_230;
      }
      CLIntercept::checkTimingEvents(in_stack_000000c8);
      pSVar5 = CLIntercept::config(local_38);
      if (((pSVar5->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar5 = CLIntercept::config(local_38), (pSVar5->HostPerformanceTiming & 1U) != 0 ||
          (pSVar5 = CLIntercept::config(local_38), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
        local_238 = std::chrono::_V2::steady_clock::now();
        local_228 = local_238;
        pSVar5 = CLIntercept::config(local_38);
        if (((pSVar5->HostPerformanceTiming & 1U) != 0) &&
           (bVar2 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_38,(uint64_t)local_48), bVar2)) {
          paVar8 = &local_259;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_258,"",paVar8);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffc00.__d.__r,
                     (char *)in_stack_fffffffffffffbf8.__d.__r,(string *)in_stack_fffffffffffffbf0,
                     in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
          std::__cxx11::string::~string(local_258);
          std::allocator<char>::~allocator((allocator<char> *)&local_259);
        }
        pSVar5 = CLIntercept::config(local_38);
        if ((pSVar5->ChromeCallLogging & 1U) != 0) {
          paVar8 = (allocator *)&stack0xfffffffffffffd6f;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&stack0xfffffffffffffd70,"",paVar8);
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffbf0,&in_stack_fffffffffffffbe8->SuppressLogging,
                     (string *)in_stack_fffffffffffffbe0,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffbd0,in_stack_fffffffffffffc00,
                     in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd6f);
        }
      }
    }
    pSVar5 = CLIntercept::config(local_38);
    if (((pSVar5->AubCapture & 1U) != 0) &&
       ((pSVar5 = CLIntercept::config(local_38), (pSVar5->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar2 = CLIntercept::checkAubCaptureEnqueueLimits(local_38,(uint64_t)local_48), !bVar2))))
    {
      CLIntercept::stopAubCapture
                (in_stack_fffffffffffffba0,(cl_command_queue)in_stack_fffffffffffffb98);
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueSVMUnmap) (
    cl_command_queue command_queue,
    void* svm_ptr,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueSVMUnmap )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START( command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            const std::string eventWaitListString = getFormattedEventWaitList(
                pIntercept,
                num_events_in_wait_list,
                event_wait_list);

            CALL_LOGGING_ENTER( "queue = %p, svm_ptr = %p%s",
                command_queue,
                svm_ptr,
                eventWaitListString.c_str() );
            CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
            DEVICE_PERFORMANCE_TIMING_START( event );
            HOST_PERFORMANCE_TIMING_START();

            retVal = pIntercept->dispatch().clEnqueueSVMUnmap(
                command_queue,
                svm_ptr,
                num_events_in_wait_list,
                event_wait_list,
                event );

            HOST_PERFORMANCE_TIMING_END();
            DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
            CHECK_ERROR( retVal );
            REMOVE_MAP_PTR( svm_ptr );
            ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
            CALL_LOGGING_EXIT_EVENT( retVal, event );
            ADD_EVENT( event ? event[0] : NULL );
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}